

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-impl-ncurses.cpp
# Opt level: O2

bool ImTui_ImplNcurses_NewFrame(void)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ImGuiIO *pIVar4;
  ImGuiIO *pIVar5;
  ImGuiIO *pIVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  float fVar10;
  float fVar13;
  ImVec2 IVar11;
  undefined1 auVar12 [16];
  MEVENT event;
  int local_44;
  int local_40;
  int local_3c;
  uint local_34;
  
  if (_stdscr == 0) {
    fVar10 = -1.0;
    fVar13 = -1.0;
  }
  else {
    auVar12 = pshuflw(ZEXT416(*(uint *)(_stdscr + 4)),ZEXT416(*(uint *)(_stdscr + 4)),0x60);
    fVar10 = (float)((auVar12._0_4_ >> 0x10) + 1);
    fVar13 = (float)((auVar12._4_4_ >> 0x10) + 1);
  }
  pIVar4 = ImGui::GetIO();
  IVar11.y = fVar10;
  IVar11.x = fVar13;
  pIVar4->DisplaySize = IVar11;
  bVar9 = false;
  ImTui_ImplNcurses_NewFrame::input[2] = '\0';
  pIVar4 = ImGui::GetIO();
  local_44 = 0;
  std::__fill_a1<bool*,int>(pIVar4->KeysDown,(bool *)pIVar4->NavInputs,&local_44);
  pIVar5 = ImGui::GetIO();
  pIVar5->KeyCtrl = false;
  pIVar5 = ImGui::GetIO();
  pIVar5->KeyShift = false;
LAB_0010da1b:
  iVar2 = wgetch(_stdscr);
  if (iVar2 == 0x199) {
    iVar2 = getmouse(&local_44);
    if (iVar2 == 0) {
      ImTui_ImplNcurses_NewFrame::mx = local_40;
      ImTui_ImplNcurses_NewFrame::my = local_3c;
      ImTui_ImplNcurses_NewFrame::mstate = (unsigned_long)local_34;
      if ((local_34 & 0xf) == 2) {
        ImTui_ImplNcurses_NewFrame()::lbut = 1;
      }
      else if ((local_34 & 0xf) == 1) {
        ImTui_ImplNcurses_NewFrame()::lbut = 0;
      }
      if ((short)(local_34 & 0xf000) == 0x2000) {
        ImTui_ImplNcurses_NewFrame()::rbut = 1;
      }
      else if ((local_34 & 0xf000) == 0x1000) {
        ImTui_ImplNcurses_NewFrame()::rbut = 0;
      }
      uVar3 = local_34 & 0xf000000;
      pIVar5 = ImGui::GetIO();
      pIVar5->KeyCtrl = (bool)(pIVar5->KeyCtrl | uVar3 == 0x1000000);
    }
  }
  else {
    if (iVar2 == -1) {
      if (((uint)ImTui_ImplNcurses_NewFrame::mstate & 0xf) == 1) {
        ImTui_ImplNcurses_NewFrame()::lbut = 0;
        ImTui_ImplNcurses_NewFrame()::rbut = 0;
      }
      pIVar4 = ImGui::GetIO();
      pIVar5 = ImGui::GetIO();
      if (pIVar4->KeysDown[pIVar5->KeyMap[0x10]] == true) {
        pIVar4 = ImGui::GetIO();
        pIVar4->KeyCtrl = true;
      }
      pIVar4 = ImGui::GetIO();
      pIVar5 = ImGui::GetIO();
      if (pIVar4->KeysDown[pIVar5->KeyMap[0x11]] == true) {
        pIVar4 = ImGui::GetIO();
        pIVar4->KeyCtrl = true;
      }
      pIVar4 = ImGui::GetIO();
      pIVar5 = ImGui::GetIO();
      if (pIVar4->KeysDown[pIVar5->KeyMap[0x12]] == true) {
        pIVar4 = ImGui::GetIO();
        pIVar4->KeyCtrl = true;
      }
      pIVar4 = ImGui::GetIO();
      pIVar5 = ImGui::GetIO();
      if (pIVar4->KeysDown[pIVar5->KeyMap[0x13]] == true) {
        pIVar4 = ImGui::GetIO();
        pIVar4->KeyCtrl = true;
      }
      pIVar4 = ImGui::GetIO();
      pIVar5 = ImGui::GetIO();
      if (pIVar4->KeysDown[pIVar5->KeyMap[0x14]] == true) {
        pIVar4 = ImGui::GetIO();
        pIVar4->KeyCtrl = true;
      }
      pIVar4 = ImGui::GetIO();
      pIVar5 = ImGui::GetIO();
      if (pIVar4->KeysDown[pIVar5->KeyMap[0x15]] == true) {
        pIVar4 = ImGui::GetIO();
        pIVar4->KeyCtrl = true;
      }
      fVar10 = (float)ImTui_ImplNcurses_NewFrame::mx;
      pIVar4 = ImGui::GetIO();
      (pIVar4->MousePos).x = fVar10;
      fVar10 = (float)ImTui_ImplNcurses_NewFrame::my;
      pIVar4 = ImGui::GetIO();
      (pIVar4->MousePos).y = fVar10;
      bVar1 = (bool)ImTui_ImplNcurses_NewFrame()::lbut;
      pIVar4 = ImGui::GetIO();
      pIVar4->MouseDown[0] = bVar1;
      bVar1 = (bool)ImTui_ImplNcurses_NewFrame()::rbut;
      pIVar4 = ImGui::GetIO();
      pIVar4->MouseDown[1] = bVar1;
      lVar7 = std::chrono::_V2::system_clock::now();
      uVar8 = lVar7 / 1000 - g_vsync.tLast_us;
      g_vsync.tLast_us = lVar7 / 1000;
      pIVar4 = ImGui::GetIO();
      pIVar4->DeltaTime = (float)uVar8 / 1e+06;
      return bVar9;
    }
    ImTui_ImplNcurses_NewFrame::input._0_2_ = (undefined2)iVar2;
    if ((iVar2 < 0x7f) && (pIVar5 = ImGui::GetIO(), iVar2 != pIVar5->KeyMap[0xd])) {
      pIVar5 = ImGui::GetIO();
      ImGuiIO::AddInputCharactersUTF8(pIVar5,ImTui_ImplNcurses_NewFrame::input);
    }
    switch(iVar2) {
    case 0x102:
      pIVar5 = ImGui::GetIO();
      pIVar6 = ImGui::GetIO();
      lVar7 = (long)pIVar6->KeyMap[4];
      break;
    case 0x103:
      pIVar5 = ImGui::GetIO();
      pIVar6 = ImGui::GetIO();
      lVar7 = (long)pIVar6->KeyMap[3];
      break;
    case 0x104:
      pIVar5 = ImGui::GetIO();
      pIVar6 = ImGui::GetIO();
      lVar7 = (long)pIVar6->KeyMap[1];
      break;
    case 0x105:
      pIVar5 = ImGui::GetIO();
      pIVar6 = ImGui::GetIO();
      lVar7 = (long)pIVar6->KeyMap[2];
      break;
    case 0x106:
switchD_0010db24_caseD_106:
      pIVar4->KeysDown[iVar2] = true;
      goto LAB_0010dbe2;
    case 0x107:
switchD_0010db24_caseD_107:
      pIVar5 = ImGui::GetIO();
      pIVar6 = ImGui::GetIO();
      lVar7 = (long)pIVar6->KeyMap[0xb];
      break;
    default:
      if (iVar2 == 0x7f) goto switchD_0010db24_caseD_107;
      if (iVar2 == 0x192) {
        pIVar6 = ImGui::GetIO();
        pIVar5 = ImGui::GetIO();
        lVar7 = (long)pIVar5->KeyMap[2];
      }
      else if (iVar2 == 0x150) {
        pIVar6 = ImGui::GetIO();
        pIVar5 = ImGui::GetIO();
        lVar7 = (long)pIVar5->KeyMap[4];
      }
      else if (iVar2 == 0x151) {
        pIVar6 = ImGui::GetIO();
        pIVar5 = ImGui::GetIO();
        lVar7 = (long)pIVar5->KeyMap[3];
      }
      else {
        if (iVar2 != 0x189) {
          if (iVar2 != 0x14a) goto switchD_0010db24_caseD_106;
          pIVar5 = ImGui::GetIO();
          pIVar6 = ImGui::GetIO();
          lVar7 = (long)pIVar6->KeyMap[10];
          break;
        }
        pIVar6 = ImGui::GetIO();
        pIVar5 = ImGui::GetIO();
        lVar7 = (long)pIVar5->KeyMap[1];
      }
      bVar9 = true;
      pIVar6->KeysDown[lVar7] = true;
      pIVar5 = ImGui::GetIO();
      pIVar5->KeyShift = true;
      goto LAB_0010da1b;
    }
    pIVar5->KeysDown[lVar7] = true;
  }
LAB_0010dbe2:
  bVar9 = true;
  goto LAB_0010da1b;
}

Assistant:

bool ImTui_ImplNcurses_NewFrame() {
    bool hasInput = false;

	int screenSizeX = 0;
	int screenSizeY = 0;

	getmaxyx(stdscr, screenSizeY, screenSizeX);
	ImGui::GetIO().DisplaySize = ImVec2(screenSizeX, screenSizeY);

    static int mx = 0;
    static int my = 0;
    static int lbut = 0;
    static int rbut = 0;
    static unsigned long mstate = 0;
    static char input[3];

    input[2] = 0;

    auto & keysDown = ImGui::GetIO().KeysDown;
    std::fill(keysDown, keysDown + 512, 0);

    ImGui::GetIO().KeyCtrl = false;
    ImGui::GetIO().KeyShift = false;

    while (true) {
        int c = wgetch(stdscr);

        if (c == ERR) {
            if ((mstate & 0xf) == 0x1) {
                lbut = 0;
                rbut = 0;
            }
            break;
        } else if (c == KEY_MOUSE) {
            MEVENT event;
            if (getmouse(&event) == OK) {
                mx = event.x;
                my = event.y;
                mstate = event.bstate;
                if ((mstate & 0x000f) == 0x0002) lbut = 1;
                if ((mstate & 0x000f) == 0x0001) lbut = 0;
                if ((mstate & 0xf000) == 0x2000) rbut = 1;
                if ((mstate & 0xf000) == 0x1000) rbut = 0;
                //printf("mstate = 0x%016lx\n", mstate);
                ImGui::GetIO().KeyCtrl |= ((mstate & 0x0F000000) == 0x01000000);
            }
        } else {
            input[0] = (c & 0x000000FF);
            input[1] = (c & 0x0000FF00) >> 8;
            //printf("c = %d, c0 = %d, c1 = %d xxx\n", c, input[0], input[1]);
            if (c < 127) {
                if (c != ImGui::GetIO().KeyMap[ImGuiKey_Enter]) {
                    ImGui::GetIO().AddInputCharactersUTF8(input);
                }
            }
            if (c == 330) {
                ImGui::GetIO().KeysDown[ImGui::GetIO().KeyMap[ImGuiKey_Delete]] = true;
            } else if (c == KEY_BACKSPACE || c == KEY_DC || c == 127) {
                ImGui::GetIO().KeysDown[ImGui::GetIO().KeyMap[ImGuiKey_Backspace]] = true;
            // Shift + arrows (probably not portable :()
            } else if (c == 393) {
                ImGui::GetIO().KeysDown[ImGui::GetIO().KeyMap[ImGuiKey_LeftArrow]] = true;
                ImGui::GetIO().KeyShift = true;
            } else if (c == 402) {
                ImGui::GetIO().KeysDown[ImGui::GetIO().KeyMap[ImGuiKey_RightArrow]] = true;
                ImGui::GetIO().KeyShift = true;
            } else if (c == 337) {
                ImGui::GetIO().KeysDown[ImGui::GetIO().KeyMap[ImGuiKey_UpArrow]] = true;
                ImGui::GetIO().KeyShift = true;
            } else if (c == 336) {
                ImGui::GetIO().KeysDown[ImGui::GetIO().KeyMap[ImGuiKey_DownArrow]] = true;
                ImGui::GetIO().KeyShift = true;
            } else if (c == KEY_BACKSPACE) {
                ImGui::GetIO().KeysDown[ImGui::GetIO().KeyMap[ImGuiKey_Backspace]] = true;
            } else if (c == KEY_LEFT) {
                ImGui::GetIO().KeysDown[ImGui::GetIO().KeyMap[ImGuiKey_LeftArrow]] = true;
            } else if (c == KEY_RIGHT) {
                ImGui::GetIO().KeysDown[ImGui::GetIO().KeyMap[ImGuiKey_RightArrow]] = true;
            } else if (c == KEY_UP) {
                ImGui::GetIO().KeysDown[ImGui::GetIO().KeyMap[ImGuiKey_UpArrow]] = true;
            } else if (c == KEY_DOWN) {
                ImGui::GetIO().KeysDown[ImGui::GetIO().KeyMap[ImGuiKey_DownArrow]] = true;
            } else {
                keysDown[c] = true;
            }
        }

        hasInput = true;
    }

    if (ImGui::GetIO().KeysDown[ImGui::GetIO().KeyMap[ImGuiKey_A]]) ImGui::GetIO().KeyCtrl = true;
    if (ImGui::GetIO().KeysDown[ImGui::GetIO().KeyMap[ImGuiKey_C]]) ImGui::GetIO().KeyCtrl = true;
    if (ImGui::GetIO().KeysDown[ImGui::GetIO().KeyMap[ImGuiKey_V]]) ImGui::GetIO().KeyCtrl = true;
    if (ImGui::GetIO().KeysDown[ImGui::GetIO().KeyMap[ImGuiKey_X]]) ImGui::GetIO().KeyCtrl = true;
    if (ImGui::GetIO().KeysDown[ImGui::GetIO().KeyMap[ImGuiKey_Y]]) ImGui::GetIO().KeyCtrl = true;
    if (ImGui::GetIO().KeysDown[ImGui::GetIO().KeyMap[ImGuiKey_Z]]) ImGui::GetIO().KeyCtrl = true;

    ImGui::GetIO().MousePos.x = mx;
    ImGui::GetIO().MousePos.y = my;
    ImGui::GetIO().MouseDown[0] = lbut;
    ImGui::GetIO().MouseDown[1] = rbut;

    ImGui::GetIO().DeltaTime = g_vsync.delta_s();

    return hasInput;
}